

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

int DnsStats::GetDnsName
              (uint8_t *packet,uint32_t length,uint32_t start,uint8_t *name,size_t name_max,
              size_t *name_length)

{
  uint32_t uVar1;
  size_t sVar2;
  uint32_t local_50;
  uint local_4c;
  uint32_t flags;
  uint32_t new_start;
  size_t name_index;
  uint local_38;
  uint32_t start_next;
  uint32_t name_start;
  uint32_t l;
  size_t *name_length_local;
  size_t name_max_local;
  uint8_t *name_local;
  uint32_t start_local;
  uint32_t length_local;
  uint8_t *packet_local;
  
  name_index._4_4_ = 0;
  _flags = (size_t *)0x0;
  local_38 = start;
  _name_start = name_length;
  name_length_local = (size_t *)name_max;
  name_max_local = (size_t)name;
  uVar1 = start;
  name_local._4_4_ = length;
  _start_local = packet;
LAB_001913aa:
  do {
    name_local._0_4_ = uVar1;
    if (name_local._4_4_ <= (uint)name_local || name_length_local <= _flags) {
LAB_0019153c:
      *(undefined1 *)(name_max_local + (long)_flags) = 0;
      *_name_start = (size_t)_flags;
      return name_index._4_4_;
    }
    start_next = (uint32_t)_start_local[(uint)name_local];
    if (start_next == 0) {
      if (name_index._4_4_ == 0) {
        name_index._4_4_ = (uint)name_local + 1;
      }
      goto LAB_0019153c;
    }
    if ((start_next & 0xc0) != 0xc0) {
      if (0x3f < start_next) {
        _flags = (size_t *)0x0;
        name_index._4_4_ = name_local._4_4_;
        goto LAB_0019153c;
      }
      if ((name_local._4_4_ < (uint)name_local + start_next + 1) ||
         (name_length_local < (size_t *)((long)_flags + (ulong)start_next + 2))) {
        _flags = (size_t *)0x0;
        name_index._4_4_ = name_local._4_4_;
        goto LAB_0019153c;
      }
      if ((_flags != (size_t *)0x0) && ((size_t *)((long)_flags + 1U) < name_length_local)) {
        *(undefined1 *)(name_max_local + (long)_flags) = 0x2e;
        _flags = (size_t *)((long)_flags + 1);
      }
      sVar2 = NormalizeNamePart(start_next,_start_local + ((uint)name_local + 1),
                                (uint8_t *)(name_max_local + (long)_flags),
                                (long)name_length_local - (long)_flags,&local_50);
      _flags = (size_t *)(sVar2 + (long)_flags);
      uVar1 = start_next + 1 + (uint)name_local;
      goto LAB_001913aa;
    }
    if (name_local._4_4_ < (uint)name_local + 2) {
      name_index._4_4_ = name_local._4_4_;
      goto LAB_0019153c;
    }
    local_4c = (start_next & 0x3f) * 0x100 + (uint)_start_local[(uint)name_local + 1];
    if (local_38 <= local_4c) {
      _flags = (size_t *)0x0;
      name_index._4_4_ = name_local._4_4_;
      goto LAB_0019153c;
    }
    uVar1 = local_4c;
    if (name_index._4_4_ == 0) {
      name_index._4_4_ = (uint)name_local + 2;
      uVar1 = local_4c;
    }
  } while( true );
}

Assistant:

int DnsStats::GetDnsName(uint8_t * packet, uint32_t length, uint32_t start,
    uint8_t * name, size_t name_max, size_t * name_length)
{
    uint32_t l = 0;
    uint32_t name_start = start;
    uint32_t start_next = 0;
    size_t name_index = 0;

    while (start <length && name_index < name_max) {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/
            start++;

            if (start_next == 0) {
                start_next = start;
            }
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            if ((start + 2) > length)
            {
                /* error */
                start_next = length;
                break;
            }
            else
            {
                uint32_t new_start = ((l & 63) << 8) + packet[start + 1];

                if (new_start < name_start)
                {
                    if (start_next == 0) {
                        start_next = start + 2;
                    }
                    start = new_start;
                } else {
                    /* Basic restriction to avoid name decoding loops */
                    name_index = 0;
                    start_next = length;
                    break;
                }
            }
        }
        else if (l > 0x3F)
        {
            /* found an extension. Don't know how to parse it! */
            name_index = 0;
            start_next = length;
            break;
        }
        else
        {
            /* add a label to the name. */
            if (start + l + 1 > length ||
                name_index + l + 2 > name_max)
            {
                /* format error */
                name_index = 0;
                start_next = length;
                break;
            }
            else
            {
                uint32_t flags;
                if (name_index > 0 && name_index+1 < name_max) {
                    name[name_index++] = '.';
                }

                name_index += NormalizeNamePart(l, &packet[start + 1], name + name_index, name_max - name_index, &flags);

                start += l + 1; 
            }
        }
    }

    name[name_index] = 0;

    *name_length = name_index;

    return start_next;
}